

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infback.c
# Opt level: O0

int inflateBack(z_streamp strm,in_func in,void *in_desc,out_func out,void *out_desc)

{
  ushort uVar1;
  undefined2 uVar2;
  undefined4 uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  undefined1 *puVar8;
  uint local_c0;
  uInt local_84;
  int local_80;
  int ret;
  uint len;
  code last;
  code here;
  uchar *from;
  uint copy;
  uint bits;
  unsigned_long hold;
  uint left;
  uint have;
  uchar *put;
  uchar *next;
  inflate_state *state;
  void *out_desc_local;
  out_func out_local;
  void *in_desc_local;
  in_func in_local;
  z_streamp strm_local;
  
  if ((strm == (z_streamp)0x0) || (strm->state == (internal_state *)0x0)) {
    strm_local._4_4_ = -2;
  }
  else {
    next = (uchar *)strm->state;
    strm->msg = (char *)0x0;
    ((internal_state *)next)->status = 0x3f3f;
    *(undefined4 *)&((internal_state *)next)->field_0xc = 0;
    *(undefined4 *)&((internal_state *)next)->gzindex = 0;
    put = strm->next_in;
    if (put == (Bytef *)0x0) {
      local_84 = 0;
    }
    else {
      local_84 = strm->avail_in;
    }
    hold._4_4_ = local_84;
    _copy = 0;
    from._4_4_ = 0;
    hold._0_4_ = *(uint *)((long)&((internal_state *)next)->gzhead + 4);
    _left = *(undefined1 **)&((internal_state *)next)->method;
    state = (inflate_state *)out_desc;
    out_desc_local = out;
    out_local = (out_func)in_desc;
    in_desc_local = in;
    in_local = (in_func)strm;
LAB_001fedf6:
    switch(*(undefined4 *)(next + 8)) {
    case 0x3f3f:
      if (*(int *)(next + 0xc) == 0) {
        for (; uVar7 = _copy, from._4_4_ < 3; from._4_4_ = from._4_4_ + 8) {
          if ((hold._4_4_ == 0) &&
             (hold._4_4_ = (*(code *)in_desc_local)(out_local,&put), hold._4_4_ == 0)) {
            put = (uchar *)0x0;
            local_80 = -5;
            hold._4_4_ = 0;
            goto LAB_002003c8;
          }
          hold._4_4_ = hold._4_4_ - 1;
          _copy = ((ulong)*put << ((byte)from._4_4_ & 0x3f)) + _copy;
          put = put + 1;
        }
        *(uint *)(next + 0xc) = (uint)_copy & 1;
        copy = (uint)(_copy >> 1);
        switch(copy & 3) {
        case 0:
          next[8] = 'A';
          next[9] = '?';
          next[10] = '\0';
          next[0xb] = '\0';
          break;
        case 1:
          fixedtables((inflate_state *)next);
          next[8] = 'H';
          next[9] = '?';
          next[10] = '\0';
          next[0xb] = '\0';
          break;
        case 2:
          next[8] = 'D';
          next[9] = '?';
          next[10] = '\0';
          next[0xb] = '\0';
          break;
        case 3:
          *(char **)(in_local + 0x30) = "invalid block type";
          next[8] = 'Q';
          next[9] = '?';
          next[10] = '\0';
          next[0xb] = '\0';
        }
        _copy = uVar7 >> 3;
        from._4_4_ = from._4_4_ - 3;
      }
      else {
        _copy = _copy >> ((byte)from._4_4_ & 7);
        from._4_4_ = from._4_4_ - (from._4_4_ & 7);
        next[8] = 'P';
        next[9] = '?';
        next[10] = '\0';
        next[0xb] = '\0';
      }
      goto LAB_001fedf6;
    default:
      local_80 = -2;
LAB_002003c8:
      if ((((uint)hold < *(uint *)(next + 0x3c)) &&
          (iVar6 = (*(code *)out_desc_local)
                             (state,*(undefined8 *)(next + 0x48),*(int *)(next + 0x3c) - (uint)hold)
          , iVar6 != 0)) && (local_80 == 1)) {
        local_80 = -5;
      }
      *(uchar **)in_local = put;
      *(uInt *)(in_local + 8) = hold._4_4_;
      strm_local._4_4_ = local_80;
      break;
    case 0x3f41:
      _copy = _copy >> ((byte)from._4_4_ & 7);
      for (from._4_4_ = from._4_4_ - (from._4_4_ & 7); from._4_4_ < 0x20;
          from._4_4_ = from._4_4_ + 8) {
        if ((hold._4_4_ == 0) &&
           (hold._4_4_ = (*(code *)in_desc_local)(out_local,&put), hold._4_4_ == 0)) {
          put = (uchar *)0x0;
          local_80 = -5;
          hold._4_4_ = 0;
          goto LAB_002003c8;
        }
        hold._4_4_ = hold._4_4_ - 1;
        _copy = ((ulong)*put << ((byte)from._4_4_ & 0x3f)) + _copy;
        put = put + 1;
      }
      if ((_copy & 0xffff) == (_copy >> 0x10 ^ 0xffff)) {
        *(uint *)(next + 0x5c) = (uint)_copy & 0xffff;
        _copy = 0;
        from._4_4_ = 0;
        while (*(int *)(next + 0x5c) != 0) {
          from._0_4_ = *(uint *)(next + 0x5c);
          if ((hold._4_4_ == 0) &&
             (hold._4_4_ = (*(code *)in_desc_local)(out_local,&put), hold._4_4_ == 0)) {
            put = (uchar *)0x0;
            local_80 = -5;
            goto LAB_002003c8;
          }
          if ((uint)hold == 0) {
            _left = *(undefined1 **)(next + 0x48);
            hold._0_4_ = *(uint *)(next + 0x3c);
            *(uint *)(next + 0x40) = (uint)hold;
            iVar6 = (*(code *)out_desc_local)(state,_left,(uint)hold);
            if (iVar6 != 0) {
              local_80 = -5;
              goto LAB_002003c8;
            }
          }
          if (hold._4_4_ < (uint)from) {
            from._0_4_ = hold._4_4_;
          }
          if ((uint)hold < (uint)from) {
            from._0_4_ = (uint)hold;
          }
          memcpy(_left,put,(ulong)(uint)from);
          hold._4_4_ = hold._4_4_ - (uint)from;
          put = put + (uint)from;
          hold._0_4_ = (uint)hold - (uint)from;
          _left = _left + (uint)from;
          *(uint *)(next + 0x5c) = *(int *)(next + 0x5c) - (uint)from;
        }
        next[8] = '?';
        next[9] = '?';
        next[10] = '\0';
        next[0xb] = '\0';
      }
      else {
        *(char **)(in_local + 0x30) = "invalid stored block lengths";
        next[8] = 'Q';
        next[9] = '?';
        next[10] = '\0';
        next[0xb] = '\0';
      }
      goto LAB_001fedf6;
    case 0x3f44:
      for (; from._4_4_ < 0xe; from._4_4_ = from._4_4_ + 8) {
        if ((hold._4_4_ == 0) &&
           (hold._4_4_ = (*(code *)in_desc_local)(out_local,&put), hold._4_4_ == 0)) {
          put = (uchar *)0x0;
          local_80 = -5;
          hold._4_4_ = 0;
          goto LAB_002003c8;
        }
        hold._4_4_ = hold._4_4_ - 1;
        _copy = ((ulong)*put << ((byte)from._4_4_ & 0x3f)) + _copy;
        put = put + 1;
      }
      *(uint *)(next + 0x84) = ((uint)_copy & 0x1f) + 0x101;
      *(uint *)(next + 0x88) = ((uint)(_copy >> 5) & 0x1f) + 1;
      *(uint *)(next + 0x80) = ((uint)(_copy >> 10) & 0xf) + 4;
      _copy = _copy >> 0xe;
      from._4_4_ = from._4_4_ - 0xe;
      if ((*(uint *)(next + 0x84) < 0x11f) && (*(uint *)(next + 0x88) < 0x1f)) {
        next[0x8c] = '\0';
        next[0x8d] = '\0';
        next[0x8e] = '\0';
        next[0x8f] = '\0';
        while (*(uint *)(next + 0x8c) < *(uint *)(next + 0x80)) {
          for (; from._4_4_ < 3; from._4_4_ = from._4_4_ + 8) {
            if ((hold._4_4_ == 0) &&
               (hold._4_4_ = (*(code *)in_desc_local)(out_local,&put), hold._4_4_ == 0)) {
              put = (uchar *)0x0;
              local_80 = -5;
              hold._4_4_ = 0;
              goto LAB_002003c8;
            }
            hold._4_4_ = hold._4_4_ - 1;
            _copy = ((ulong)*put << ((byte)from._4_4_ & 0x3f)) + _copy;
            put = put + 1;
          }
          uVar5 = *(uint *)(next + 0x8c);
          *(uint *)(next + 0x8c) = uVar5 + 1;
          *(ushort *)(next + (ulong)inflateBack::order[uVar5] * 2 + 0x98) = (ushort)_copy & 7;
          _copy = _copy >> 3;
          from._4_4_ = from._4_4_ - 3;
        }
        while (*(uint *)(next + 0x8c) < 0x13) {
          uVar5 = *(uint *)(next + 0x8c);
          *(uint *)(next + 0x8c) = uVar5 + 1;
          uVar1 = inflateBack::order[uVar5];
          (next + (ulong)uVar1 * 2 + 0x98)[0] = '\0';
          (next + (ulong)uVar1 * 2 + 0x98)[1] = '\0';
        }
        *(uchar **)(next + 0x90) = next + 0x558;
        *(undefined8 *)(next + 0x68) = *(undefined8 *)(next + 0x90);
        next[0x78] = '\a';
        next[0x79] = '\0';
        next[0x7a] = '\0';
        next[0x7b] = '\0';
        iVar6 = inflate_table(CODES,(unsigned_short *)(next + 0x98),0x13,(code **)(next + 0x90),
                              (uint *)(next + 0x78),(unsigned_short *)(next + 0x318));
        if (iVar6 == 0) {
          next[0x8c] = '\0';
          next[0x8d] = '\0';
          next[0x8e] = '\0';
          next[0x8f] = '\0';
          while (*(uint *)(next + 0x8c) < (uint)(*(int *)(next + 0x84) + *(int *)(next + 0x88))) {
            while( true ) {
              uVar3 = *(undefined4 *)
                       (*(long *)(next + 0x68) +
                       (ulong)((uint)_copy & (1 << ((byte)*(undefined4 *)(next + 0x78) & 0x1f)) - 1U
                              ) * 4);
              len._1_1_ = (byte)((uint)uVar3 >> 8);
              if (len._1_1_ <= from._4_4_) break;
              if ((hold._4_4_ == 0) &&
                 (hold._4_4_ = (*(code *)in_desc_local)(out_local,&put), hold._4_4_ == 0)) {
                put = (uchar *)0x0;
                local_80 = -5;
                hold._4_4_ = 0;
                goto LAB_002003c8;
              }
              hold._4_4_ = hold._4_4_ - 1;
              _copy = ((ulong)*put << ((byte)from._4_4_ & 0x3f)) + _copy;
              from._4_4_ = from._4_4_ + 8;
              put = put + 1;
            }
            len._2_2_ = (ushort)((uint)uVar3 >> 0x10);
            if (len._2_2_ < 0x10) {
              _copy = _copy >> (len._1_1_ & 0x3f);
              from._4_4_ = from._4_4_ - len._1_1_;
              uVar5 = *(uint *)(next + 0x8c);
              *(uint *)(next + 0x8c) = uVar5 + 1;
              *(ushort *)(next + (ulong)uVar5 * 2 + 0x98) = len._2_2_;
            }
            else {
              if (len._2_2_ == 0x10) {
                for (; from._4_4_ < len._1_1_ + 2; from._4_4_ = from._4_4_ + 8) {
                  if ((hold._4_4_ == 0) &&
                     (hold._4_4_ = (*(code *)in_desc_local)(out_local,&put), hold._4_4_ == 0)) {
                    put = (uchar *)0x0;
                    local_80 = -5;
                    hold._4_4_ = 0;
                    goto LAB_002003c8;
                  }
                  hold._4_4_ = hold._4_4_ - 1;
                  _copy = ((ulong)*put << ((byte)from._4_4_ & 0x3f)) + _copy;
                  put = put + 1;
                }
                _copy = _copy >> (len._1_1_ & 0x3f);
                from._4_4_ = from._4_4_ - len._1_1_;
                if (*(int *)(next + 0x8c) == 0) {
                  *(char **)(in_local + 0x30) = "invalid bit length repeat";
                  next[8] = 'Q';
                  next[9] = '?';
                  next[10] = '\0';
                  next[0xb] = '\0';
                  break;
                }
                uVar2 = *(undefined2 *)(next + (ulong)(*(int *)(next + 0x8c) - 1) * 2 + 0x98);
                from._0_4_ = ((uint)_copy & 3) + 3;
                _copy = _copy >> 2;
                from._4_4_ = from._4_4_ - 2;
              }
              else {
                if (len._2_2_ == 0x11) {
                  for (; from._4_4_ < len._1_1_ + 3; from._4_4_ = from._4_4_ + 8) {
                    if ((hold._4_4_ == 0) &&
                       (hold._4_4_ = (*(code *)in_desc_local)(out_local,&put), hold._4_4_ == 0)) {
                      put = (uchar *)0x0;
                      local_80 = -5;
                      hold._4_4_ = 0;
                      goto LAB_002003c8;
                    }
                    hold._4_4_ = hold._4_4_ - 1;
                    _copy = ((ulong)*put << ((byte)from._4_4_ & 0x3f)) + _copy;
                    put = put + 1;
                  }
                  _copy = _copy >> (len._1_1_ & 0x3f);
                  from._0_4_ = ((uint)_copy & 7) + 3;
                  _copy = _copy >> 3;
                  from._4_4_ = (from._4_4_ - len._1_1_) - 3;
                }
                else {
                  for (; from._4_4_ < len._1_1_ + 7; from._4_4_ = from._4_4_ + 8) {
                    if ((hold._4_4_ == 0) &&
                       (hold._4_4_ = (*(code *)in_desc_local)(out_local,&put), hold._4_4_ == 0)) {
                      put = (uchar *)0x0;
                      local_80 = -5;
                      hold._4_4_ = 0;
                      goto LAB_002003c8;
                    }
                    hold._4_4_ = hold._4_4_ - 1;
                    _copy = ((ulong)*put << ((byte)from._4_4_ & 0x3f)) + _copy;
                    put = put + 1;
                  }
                  _copy = _copy >> (len._1_1_ & 0x3f);
                  from._0_4_ = ((uint)_copy & 0x7f) + 0xb;
                  _copy = _copy >> 7;
                  from._4_4_ = (from._4_4_ - len._1_1_) - 7;
                }
                uVar2 = 0;
              }
              if ((uint)(*(int *)(next + 0x84) + *(int *)(next + 0x88)) <
                  *(int *)(next + 0x8c) + (uint)from) {
                *(char **)(in_local + 0x30) = "invalid bit length repeat";
                next[8] = 'Q';
                next[9] = '?';
                next[10] = '\0';
                next[0xb] = '\0';
                break;
              }
              while ((uint)from != 0) {
                uVar5 = *(uint *)(next + 0x8c);
                *(uint *)(next + 0x8c) = uVar5 + 1;
                *(undefined2 *)(next + (ulong)uVar5 * 2 + 0x98) = uVar2;
                from._0_4_ = (uint)from + -1;
              }
            }
          }
          if (*(int *)(next + 8) != 0x3f51) {
            if (*(short *)(next + 0x298) == 0) {
              *(char **)(in_local + 0x30) = "invalid code -- missing end-of-block";
              next[8] = 'Q';
              next[9] = '?';
              next[10] = '\0';
              next[0xb] = '\0';
            }
            else {
              *(uchar **)(next + 0x90) = next + 0x558;
              *(undefined8 *)(next + 0x68) = *(undefined8 *)(next + 0x90);
              next[0x78] = '\t';
              next[0x79] = '\0';
              next[0x7a] = '\0';
              next[0x7b] = '\0';
              iVar6 = inflate_table(LENS,(unsigned_short *)(next + 0x98),*(uint *)(next + 0x84),
                                    (code **)(next + 0x90),(uint *)(next + 0x78),
                                    (unsigned_short *)(next + 0x318));
              if (iVar6 == 0) {
                *(undefined8 *)(next + 0x70) = *(undefined8 *)(next + 0x90);
                next[0x7c] = '\x06';
                next[0x7d] = '\0';
                next[0x7e] = '\0';
                next[0x7f] = '\0';
                iVar6 = inflate_table(DISTS,(unsigned_short *)
                                            (next + (ulong)*(uint *)(next + 0x84) * 2 + 0x98),
                                      *(uint *)(next + 0x88),(code **)(next + 0x90),
                                      (uint *)(next + 0x7c),(unsigned_short *)(next + 0x318));
                if (iVar6 == 0) {
                  next[8] = 'H';
                  next[9] = '?';
                  next[10] = '\0';
                  next[0xb] = '\0';
                  goto switchD_001fee29_caseD_3f48;
                }
                *(char **)(in_local + 0x30) = "invalid distances set";
                next[8] = 'Q';
                next[9] = '?';
                next[10] = '\0';
                next[0xb] = '\0';
              }
              else {
                *(char **)(in_local + 0x30) = "invalid literal/lengths set";
                next[8] = 'Q';
                next[9] = '?';
                next[10] = '\0';
                next[0xb] = '\0';
              }
            }
          }
        }
        else {
          *(char **)(in_local + 0x30) = "invalid code lengths set";
          next[8] = 'Q';
          next[9] = '?';
          next[10] = '\0';
          next[0xb] = '\0';
        }
      }
      else {
        *(char **)(in_local + 0x30) = "too many length or distance symbols";
        next[8] = 'Q';
        next[9] = '?';
        next[10] = '\0';
        next[0xb] = '\0';
      }
      goto LAB_001fedf6;
    case 0x3f48:
switchD_001fee29_caseD_3f48:
      if ((hold._4_4_ < 6) || ((uint)hold < 0x102)) {
        for (; uVar5 = *(uint *)(*(long *)(next + 0x68) +
                                (ulong)((uint)_copy &
                                       (1 << ((byte)*(undefined4 *)(next + 0x78) & 0x1f)) - 1U) * 4)
            , from._4_4_ < (uVar5 >> 8 & 0xff); from._4_4_ = from._4_4_ + 8) {
          if ((hold._4_4_ == 0) &&
             (hold._4_4_ = (*(code *)in_desc_local)(out_local,&put), hold._4_4_ == 0)) {
            put = (uchar *)0x0;
            local_80 = -5;
            hold._4_4_ = 0;
            goto LAB_002003c8;
          }
          hold._4_4_ = hold._4_4_ - 1;
          _copy = ((ulong)*put << ((byte)from._4_4_ & 0x3f)) + _copy;
          put = put + 1;
        }
        len._0_1_ = (char)uVar5;
        if (((char)len != '\0') && ((uVar5 & 0xf0) == 0)) {
          while( true ) {
            ret._1_1_ = (byte)(uVar5 >> 8);
            uVar4 = *(uint *)(*(long *)(next + 0x68) +
                             (ulong)((uVar5 >> 0x10) +
                                    (((uint)_copy & (1 << (ret._1_1_ + (char)len & 0x1f)) - 1U) >>
                                    (ret._1_1_ & 0x1f))) * 4);
            if ((uint)ret._1_1_ + (uVar4 >> 8 & 0xff) <= from._4_4_) break;
            if ((hold._4_4_ == 0) &&
               (hold._4_4_ = (*(code *)in_desc_local)(out_local,&put), hold._4_4_ == 0)) {
              put = (uchar *)0x0;
              local_80 = -5;
              hold._4_4_ = 0;
              goto LAB_002003c8;
            }
            hold._4_4_ = hold._4_4_ - 1;
            _copy = ((ulong)*put << ((byte)from._4_4_ & 0x3f)) + _copy;
            from._4_4_ = from._4_4_ + 8;
            put = put + 1;
          }
          _copy = _copy >> (ret._1_1_ & 0x3f);
          from._4_4_ = from._4_4_ - ret._1_1_;
          uVar5 = uVar4;
        }
        len = uVar5;
        _copy = _copy >> (len._1_1_ & 0x3f);
        from._4_4_ = from._4_4_ - len._1_1_;
        *(uint *)(next + 0x5c) = len >> 0x10;
        if ((char)len == '\0') {
          if ((uint)hold == 0) {
            _left = *(undefined1 **)(next + 0x48);
            hold._0_4_ = *(uint *)(next + 0x3c);
            *(uint *)(next + 0x40) = (uint)hold;
            iVar6 = (*(code *)out_desc_local)(state,_left,(uint)hold);
            if (iVar6 != 0) {
              local_80 = -5;
              goto LAB_002003c8;
            }
          }
          *_left = (char)*(undefined4 *)(next + 0x5c);
          hold._0_4_ = (uint)hold - 1;
          next[8] = 'H';
          next[9] = '?';
          next[10] = '\0';
          next[0xb] = '\0';
          _left = _left + 1;
        }
        else if ((len & 0x20) == 0) {
          if ((len & 0x40) == 0) {
            *(uint *)(next + 100) = len & 0xf;
            if (*(int *)(next + 100) != 0) {
              for (; from._4_4_ < *(uint *)(next + 100); from._4_4_ = from._4_4_ + 8) {
                if ((hold._4_4_ == 0) &&
                   (hold._4_4_ = (*(code *)in_desc_local)(out_local,&put), hold._4_4_ == 0)) {
                  put = (uchar *)0x0;
                  local_80 = -5;
                  hold._4_4_ = 0;
                  goto LAB_002003c8;
                }
                hold._4_4_ = hold._4_4_ - 1;
                _copy = ((ulong)*put << ((byte)from._4_4_ & 0x3f)) + _copy;
                put = put + 1;
              }
              *(uint *)(next + 0x5c) =
                   ((uint)_copy & (1 << ((byte)*(undefined4 *)(next + 100) & 0x1f)) - 1U) +
                   *(int *)(next + 0x5c);
              _copy = _copy >> ((byte)*(undefined4 *)(next + 100) & 0x3f);
              from._4_4_ = from._4_4_ - *(int *)(next + 100);
            }
            for (; uVar5 = *(uint *)(*(long *)(next + 0x70) +
                                    (ulong)((uint)_copy &
                                           (1 << ((byte)*(undefined4 *)(next + 0x7c) & 0x1f)) - 1U)
                                    * 4), from._4_4_ < (uVar5 >> 8 & 0xff);
                from._4_4_ = from._4_4_ + 8) {
              if ((hold._4_4_ == 0) &&
                 (hold._4_4_ = (*(code *)in_desc_local)(out_local,&put), hold._4_4_ == 0)) {
                put = (uchar *)0x0;
                local_80 = -5;
                hold._4_4_ = 0;
                goto LAB_002003c8;
              }
              hold._4_4_ = hold._4_4_ - 1;
              _copy = ((ulong)*put << ((byte)from._4_4_ & 0x3f)) + _copy;
              put = put + 1;
            }
            len._0_1_ = (char)uVar5;
            if ((uVar5 & 0xf0) == 0) {
              while( true ) {
                ret._1_1_ = (byte)(uVar5 >> 8);
                uVar4 = *(uint *)(*(long *)(next + 0x70) +
                                 (ulong)((uVar5 >> 0x10) +
                                        (((uint)_copy & (1 << (ret._1_1_ + (char)len & 0x1f)) - 1U)
                                        >> (ret._1_1_ & 0x1f))) * 4);
                if ((uint)ret._1_1_ + (uVar4 >> 8 & 0xff) <= from._4_4_) break;
                if ((hold._4_4_ == 0) &&
                   (hold._4_4_ = (*(code *)in_desc_local)(out_local,&put), hold._4_4_ == 0)) {
                  put = (uchar *)0x0;
                  local_80 = -5;
                  hold._4_4_ = 0;
                  goto LAB_002003c8;
                }
                hold._4_4_ = hold._4_4_ - 1;
                _copy = ((ulong)*put << ((byte)from._4_4_ & 0x3f)) + _copy;
                from._4_4_ = from._4_4_ + 8;
                put = put + 1;
              }
              _copy = _copy >> (ret._1_1_ & 0x3f);
              from._4_4_ = from._4_4_ - ret._1_1_;
              uVar5 = uVar4;
            }
            len = uVar5;
            _copy = _copy >> (len._1_1_ & 0x3f);
            from._4_4_ = from._4_4_ - len._1_1_;
            if ((len & 0x40) == 0) {
              *(uint *)(next + 0x60) = len >> 0x10;
              *(uint *)(next + 100) = len & 0xf;
              if (*(int *)(next + 100) != 0) {
                for (; from._4_4_ < *(uint *)(next + 100); from._4_4_ = from._4_4_ + 8) {
                  if ((hold._4_4_ == 0) &&
                     (hold._4_4_ = (*(code *)in_desc_local)(out_local,&put), hold._4_4_ == 0)) {
                    put = (uchar *)0x0;
                    local_80 = -5;
                    hold._4_4_ = 0;
                    goto LAB_002003c8;
                  }
                  hold._4_4_ = hold._4_4_ - 1;
                  _copy = ((ulong)*put << ((byte)from._4_4_ & 0x3f)) + _copy;
                  put = put + 1;
                }
                *(uint *)(next + 0x60) =
                     ((uint)_copy & (1 << ((byte)*(undefined4 *)(next + 100) & 0x1f)) - 1U) +
                     *(int *)(next + 0x60);
                _copy = _copy >> ((byte)*(undefined4 *)(next + 100) & 0x3f);
                from._4_4_ = from._4_4_ - *(int *)(next + 100);
              }
              if (*(uint *)(next + 0x40) < *(uint *)(next + 0x3c)) {
                local_c0 = (uint)hold;
              }
              else {
                local_c0 = 0;
              }
              if (*(int *)(next + 0x3c) - local_c0 < *(uint *)(next + 0x60)) {
                *(char **)(in_local + 0x30) = "invalid distance too far back";
                next[8] = 'Q';
                next[9] = '?';
                next[10] = '\0';
                next[0xb] = '\0';
              }
              else {
                do {
                  if ((uint)hold == 0) {
                    _left = *(undefined1 **)(next + 0x48);
                    hold._0_4_ = *(uint *)(next + 0x3c);
                    *(uint *)(next + 0x40) = (uint)hold;
                    iVar6 = (*(code *)out_desc_local)(state,_left,(uint)hold);
                    if (iVar6 != 0) {
                      local_80 = -5;
                      goto LAB_002003c8;
                    }
                  }
                  uVar5 = *(int *)(next + 0x3c) - *(int *)(next + 0x60);
                  if (uVar5 < (uint)hold) {
                    uVar7 = (ulong)uVar5;
                    from._0_4_ = (uint)hold - uVar5;
                  }
                  else {
                    uVar7 = -(ulong)*(uint *)(next + 0x60);
                    from._0_4_ = (uint)hold;
                  }
                  _last = _left + uVar7;
                  if (*(uint *)(next + 0x5c) < (uint)from) {
                    from._0_4_ = *(uint *)(next + 0x5c);
                  }
                  *(uint *)(next + 0x5c) = *(int *)(next + 0x5c) - (uint)from;
                  hold._0_4_ = (uint)hold - (uint)from;
                  do {
                    puVar8 = _left + 1;
                    *_left = *_last;
                    from._0_4_ = (uint)from - 1;
                    _last = _last + 1;
                    _left = puVar8;
                  } while ((uint)from != 0);
                } while (*(int *)(next + 0x5c) != 0);
              }
            }
            else {
              *(char **)(in_local + 0x30) = "invalid distance code";
              next[8] = 'Q';
              next[9] = '?';
              next[10] = '\0';
              next[0xb] = '\0';
            }
          }
          else {
            *(char **)(in_local + 0x30) = "invalid literal/length code";
            next[8] = 'Q';
            next[9] = '?';
            next[10] = '\0';
            next[0xb] = '\0';
          }
        }
        else {
          next[8] = '?';
          next[9] = '?';
          next[10] = '\0';
          next[0xb] = '\0';
        }
      }
      else {
        *(undefined1 **)(in_local + 0x18) = _left;
        *(uint *)(in_local + 0x20) = (uint)hold;
        *(uchar **)in_local = put;
        *(uInt *)(in_local + 8) = hold._4_4_;
        *(ulong *)(next + 0x50) = _copy;
        *(uint *)(next + 0x58) = from._4_4_;
        if (*(uint *)(next + 0x40) < *(uint *)(next + 0x3c)) {
          *(uint *)(next + 0x40) = *(int *)(next + 0x3c) - (uint)hold;
        }
        inflate_fast((z_streamp)in_local,*(uint *)(next + 0x3c));
        hold._0_4_ = *(uint *)(in_local + 0x20);
        put = *(uchar **)in_local;
        hold._4_4_ = *(uInt *)(in_local + 8);
        _copy = *(ulong *)(next + 0x50);
        from._4_4_ = *(uint *)(next + 0x58);
        _left = *(undefined1 **)(in_local + 0x18);
      }
      goto LAB_001fedf6;
    case 0x3f50:
      local_80 = 1;
      goto LAB_002003c8;
    case 0x3f51:
      local_80 = -3;
      goto LAB_002003c8;
    }
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT inflateBack(z_streamp strm, in_func in, void FAR *in_desc,
                        out_func out, void FAR *out_desc) {
    struct inflate_state FAR *state;
    z_const unsigned char FAR *next;    /* next input */
    unsigned char FAR *put;     /* next output */
    unsigned have, left;        /* available input and output */
    unsigned long hold;         /* bit buffer */
    unsigned bits;              /* bits in bit buffer */
    unsigned copy;              /* number of stored or match bytes to copy */
    unsigned char FAR *from;    /* where to copy match bytes from */
    code here;                  /* current decoding table entry */
    code last;                  /* parent table entry */
    unsigned len;               /* length to copy for repeats, bits to drop */
    int ret;                    /* return code */
    static const unsigned short order[19] = /* permutation of code lengths */
        {16, 17, 18, 0, 8, 7, 9, 6, 10, 5, 11, 4, 12, 3, 13, 2, 14, 1, 15};

    /* Check that the strm exists and that the state was initialized */
    if (strm == Z_NULL || strm->state == Z_NULL)
        return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;

    /* Reset the state */
    strm->msg = Z_NULL;
    state->mode = TYPE;
    state->last = 0;
    state->whave = 0;
    next = strm->next_in;
    have = next != Z_NULL ? strm->avail_in : 0;
    hold = 0;
    bits = 0;
    put = state->window;
    left = state->wsize;

    /* Inflate until end of block marked as last */
    for (;;)
        switch (state->mode) {
        case TYPE:
            /* determine and dispatch block type */
            if (state->last) {
                BYTEBITS();
                state->mode = DONE;
                break;
            }
            NEEDBITS(3);
            state->last = BITS(1);
            DROPBITS(1);
            switch (BITS(2)) {
            case 0:                             /* stored block */
                Tracev((stderr, "inflate:     stored block%s\n",
                        state->last ? " (last)" : ""));
                state->mode = STORED;
                break;
            case 1:                             /* fixed block */
                fixedtables(state);
                Tracev((stderr, "inflate:     fixed codes block%s\n",
                        state->last ? " (last)" : ""));
                state->mode = LEN;              /* decode codes */
                break;
            case 2:                             /* dynamic block */
                Tracev((stderr, "inflate:     dynamic codes block%s\n",
                        state->last ? " (last)" : ""));
                state->mode = TABLE;
                break;
            case 3:
                strm->msg = (char *)"invalid block type";
                state->mode = BAD;
            }
            DROPBITS(2);
            break;

        case STORED:
            /* get and verify stored block length */
            BYTEBITS();                         /* go to byte boundary */
            NEEDBITS(32);
            if ((hold & 0xffff) != ((hold >> 16) ^ 0xffff)) {
                strm->msg = (char *)"invalid stored block lengths";
                state->mode = BAD;
                break;
            }
            state->length = (unsigned)hold & 0xffff;
            Tracev((stderr, "inflate:       stored length %u\n",
                    state->length));
            INITBITS();

            /* copy stored block from input to output */
            while (state->length != 0) {
                copy = state->length;
                PULL();
                ROOM();
                if (copy > have) copy = have;
                if (copy > left) copy = left;
                zmemcpy(put, next, copy);
                have -= copy;
                next += copy;
                left -= copy;
                put += copy;
                state->length -= copy;
            }
            Tracev((stderr, "inflate:       stored end\n"));
            state->mode = TYPE;
            break;

        case TABLE:
            /* get dynamic table entries descriptor */
            NEEDBITS(14);
            state->nlen = BITS(5) + 257;
            DROPBITS(5);
            state->ndist = BITS(5) + 1;
            DROPBITS(5);
            state->ncode = BITS(4) + 4;
            DROPBITS(4);
#ifndef PKZIP_BUG_WORKAROUND
            if (state->nlen > 286 || state->ndist > 30) {
                strm->msg = (char *)"too many length or distance symbols";
                state->mode = BAD;
                break;
            }
#endif
            Tracev((stderr, "inflate:       table sizes ok\n"));

            /* get code length code lengths (not a typo) */
            state->have = 0;
            while (state->have < state->ncode) {
                NEEDBITS(3);
                state->lens[order[state->have++]] = (unsigned short)BITS(3);
                DROPBITS(3);
            }
            while (state->have < 19)
                state->lens[order[state->have++]] = 0;
            state->next = state->codes;
            state->lencode = (code const FAR *)(state->next);
            state->lenbits = 7;
            ret = inflate_table(CODES, state->lens, 19, &(state->next),
                                &(state->lenbits), state->work);
            if (ret) {
                strm->msg = (char *)"invalid code lengths set";
                state->mode = BAD;
                break;
            }
            Tracev((stderr, "inflate:       code lengths ok\n"));

            /* get length and distance code code lengths */
            state->have = 0;
            while (state->have < state->nlen + state->ndist) {
                for (;;) {
                    here = state->lencode[BITS(state->lenbits)];
                    if ((unsigned)(here.bits) <= bits) break;
                    PULLBYTE();
                }
                if (here.val < 16) {
                    DROPBITS(here.bits);
                    state->lens[state->have++] = here.val;
                }
                else {
                    if (here.val == 16) {
                        NEEDBITS(here.bits + 2);
                        DROPBITS(here.bits);
                        if (state->have == 0) {
                            strm->msg = (char *)"invalid bit length repeat";
                            state->mode = BAD;
                            break;
                        }
                        len = (unsigned)(state->lens[state->have - 1]);
                        copy = 3 + BITS(2);
                        DROPBITS(2);
                    }
                    else if (here.val == 17) {
                        NEEDBITS(here.bits + 3);
                        DROPBITS(here.bits);
                        len = 0;
                        copy = 3 + BITS(3);
                        DROPBITS(3);
                    }
                    else {
                        NEEDBITS(here.bits + 7);
                        DROPBITS(here.bits);
                        len = 0;
                        copy = 11 + BITS(7);
                        DROPBITS(7);
                    }
                    if (state->have + copy > state->nlen + state->ndist) {
                        strm->msg = (char *)"invalid bit length repeat";
                        state->mode = BAD;
                        break;
                    }
                    while (copy--)
                        state->lens[state->have++] = (unsigned short)len;
                }
            }

            /* handle error breaks in while */
            if (state->mode == BAD) break;

            /* check for end-of-block code (better have one) */
            if (state->lens[256] == 0) {
                strm->msg = (char *)"invalid code -- missing end-of-block";
                state->mode = BAD;
                break;
            }

            /* build code tables -- note: do not change the lenbits or distbits
               values here (9 and 6) without reading the comments in inftrees.h
               concerning the ENOUGH constants, which depend on those values */
            state->next = state->codes;
            state->lencode = (code const FAR *)(state->next);
            state->lenbits = 9;
            ret = inflate_table(LENS, state->lens, state->nlen, &(state->next),
                                &(state->lenbits), state->work);
            if (ret) {
                strm->msg = (char *)"invalid literal/lengths set";
                state->mode = BAD;
                break;
            }
            state->distcode = (code const FAR *)(state->next);
            state->distbits = 6;
            ret = inflate_table(DISTS, state->lens + state->nlen, state->ndist,
                            &(state->next), &(state->distbits), state->work);
            if (ret) {
                strm->msg = (char *)"invalid distances set";
                state->mode = BAD;
                break;
            }
            Tracev((stderr, "inflate:       codes ok\n"));
            state->mode = LEN;
                /* fallthrough */

        case LEN:
            /* use inflate_fast() if we have enough input and output */
            if (have >= 6 && left >= 258) {
                RESTORE();
                if (state->whave < state->wsize)
                    state->whave = state->wsize - left;
                inflate_fast(strm, state->wsize);
                LOAD();
                break;
            }

            /* get a literal, length, or end-of-block code */
            for (;;) {
                here = state->lencode[BITS(state->lenbits)];
                if ((unsigned)(here.bits) <= bits) break;
                PULLBYTE();
            }
            if (here.op && (here.op & 0xf0) == 0) {
                last = here;
                for (;;) {
                    here = state->lencode[last.val +
                            (BITS(last.bits + last.op) >> last.bits)];
                    if ((unsigned)(last.bits + here.bits) <= bits) break;
                    PULLBYTE();
                }
                DROPBITS(last.bits);
            }
            DROPBITS(here.bits);
            state->length = (unsigned)here.val;

            /* process literal */
            if (here.op == 0) {
                Tracevv((stderr, here.val >= 0x20 && here.val < 0x7f ?
                        "inflate:         literal '%c'\n" :
                        "inflate:         literal 0x%02x\n", here.val));
                ROOM();
                *put++ = (unsigned char)(state->length);
                left--;
                state->mode = LEN;
                break;
            }

            /* process end of block */
            if (here.op & 32) {
                Tracevv((stderr, "inflate:         end of block\n"));
                state->mode = TYPE;
                break;
            }

            /* invalid code */
            if (here.op & 64) {
                strm->msg = (char *)"invalid literal/length code";
                state->mode = BAD;
                break;
            }

            /* length code -- get extra bits, if any */
            state->extra = (unsigned)(here.op) & 15;
            if (state->extra != 0) {
                NEEDBITS(state->extra);
                state->length += BITS(state->extra);
                DROPBITS(state->extra);
            }
            Tracevv((stderr, "inflate:         length %u\n", state->length));

            /* get distance code */
            for (;;) {
                here = state->distcode[BITS(state->distbits)];
                if ((unsigned)(here.bits) <= bits) break;
                PULLBYTE();
            }
            if ((here.op & 0xf0) == 0) {
                last = here;
                for (;;) {
                    here = state->distcode[last.val +
                            (BITS(last.bits + last.op) >> last.bits)];
                    if ((unsigned)(last.bits + here.bits) <= bits) break;
                    PULLBYTE();
                }
                DROPBITS(last.bits);
            }
            DROPBITS(here.bits);
            if (here.op & 64) {
                strm->msg = (char *)"invalid distance code";
                state->mode = BAD;
                break;
            }
            state->offset = (unsigned)here.val;

            /* get distance extra bits, if any */
            state->extra = (unsigned)(here.op) & 15;
            if (state->extra != 0) {
                NEEDBITS(state->extra);
                state->offset += BITS(state->extra);
                DROPBITS(state->extra);
            }
            if (state->offset > state->wsize - (state->whave < state->wsize ?
                                                left : 0)) {
                strm->msg = (char *)"invalid distance too far back";
                state->mode = BAD;
                break;
            }
            Tracevv((stderr, "inflate:         distance %u\n", state->offset));

            /* copy match from window to output */
            do {
                ROOM();
                copy = state->wsize - state->offset;
                if (copy < left) {
                    from = put + copy;
                    copy = left - copy;
                }
                else {
                    from = put - state->offset;
                    copy = left;
                }
                if (copy > state->length) copy = state->length;
                state->length -= copy;
                left -= copy;
                do {
                    *put++ = *from++;
                } while (--copy);
            } while (state->length != 0);
            break;

        case DONE:
            /* inflate stream terminated properly */
            ret = Z_STREAM_END;
            goto inf_leave;

        case BAD:
            ret = Z_DATA_ERROR;
            goto inf_leave;

        default:
            /* can't happen, but makes compilers happy */
            ret = Z_STREAM_ERROR;
            goto inf_leave;
        }

    /* Write leftover output and return unused input */
  inf_leave:
    if (left < state->wsize) {
        if (out(out_desc, state->window, state->wsize - left) &&
            ret == Z_STREAM_END)
            ret = Z_BUF_ERROR;
    }
    strm->next_in = next;
    strm->avail_in = have;
    return ret;
}